

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v7::detail::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  size_t __len;
  char *pcVar7;
  byte *__s;
  byte *pbVar8;
  char *pcVar9;
  ptrdiff_t _Num;
  ulong __n;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  uint uVar13;
  ptrdiff_t _Num_1;
  bool bVar14;
  
  iVar1 = this->num_digits_;
  uVar12 = this->exp_ + iVar1;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar1 = this->num_digits_;
    iVar4 = (this->specs_).precision;
    if ((iVar1 < 2) && (((this->specs_).field_0x6 & 0x10) == 0)) {
      pcVar7 = it + 1;
      iVar6 = iVar1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar7 = it + 2;
      iVar6 = this->num_digits_;
    }
    uVar10 = iVar4 - iVar1;
    if (iVar6 != 1) {
      memmove(pcVar7,this->digits_ + 1,(long)iVar6 - 1U);
    }
    __s = (byte *)(pcVar7 + ((long)iVar6 - 1U));
    uVar13 = *(uint *)&(this->specs_).field_0x4;
    pbVar8 = __s;
    if ((uVar13 >> 0x14 & 1) != 0 && 0 < (int)uVar10) {
      pbVar8 = __s + uVar10;
      memset(__s,0x30,(ulong)uVar10);
      uVar13 = *(uint *)&(this->specs_).field_0x4;
    }
    *pbVar8 = ((uVar13 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar7 = write_exponent<char,char*>(uVar12 - 1,(char *)(pbVar8 + 1));
    return pcVar7;
  }
  if (-1 < this->exp_) {
    if (iVar1 == 0) {
      iVar4 = 0;
    }
    else {
      memmove(it,this->digits_,(long)iVar1);
      iVar4 = this->num_digits_;
    }
    pcVar9 = it + iVar1;
    uVar10 = uVar12 - iVar4;
    pcVar7 = pcVar9;
    if (uVar10 != 0 && iVar4 <= (int)uVar12) {
      pcVar7 = pcVar9 + uVar10;
      memset(pcVar9,0x30,(ulong)uVar10);
    }
    if ((((this->specs_).field_0x6 & 0x10) == 0) && (-1 < (this->specs_).precision)) {
      return pcVar7;
    }
    pcVar9 = pcVar7 + 1;
    *pcVar7 = this->decimal_point_;
    iVar1 = (this->specs_).precision;
    uVar10 = iVar1 - uVar12;
    if (uVar10 != 0 && (int)uVar12 <= iVar1) {
      memset(pcVar9,0x30,(ulong)uVar10);
      return pcVar9 + uVar10;
    }
    if ((this->specs_).field_0x4 == '\x02') {
      return pcVar9;
    }
    pcVar7[1] = '0';
    return pcVar7 + 2;
  }
  if (0 < (int)uVar12) {
    __n = (ulong)uVar12;
    memmove(it,this->digits_,__n);
    pcVar7 = it + __n;
    if (((this->specs_).field_0x6 & 0x10) != 0) {
      *pcVar7 = this->decimal_point_;
      sVar11 = (long)this->num_digits_ - __n;
      if (this->num_digits_ != uVar12) {
        memmove(pcVar7 + 1,this->digits_ + __n,sVar11);
        uVar12 = this->num_digits_;
      }
      pcVar7 = pcVar7 + 1 + sVar11;
      iVar1 = (this->specs_).precision;
      uVar10 = iVar1 - uVar12;
      if (uVar10 == 0 || iVar1 < (int)uVar12) {
        return pcVar7;
      }
      if (uVar10 == 0 || iVar1 < (int)uVar12) {
        return pcVar7;
      }
      memset(pcVar7,0x30,(ulong)uVar10);
      return pcVar7 + uVar10;
    }
    uVar5 = (ulong)(uint)this->num_digits_;
    if ((int)uVar12 < this->num_digits_) {
      do {
        if (this->digits_[uVar5 - 1] != '0') goto LAB_0024625d;
        uVar5 = uVar5 - 1;
      } while ((long)__n < (long)uVar5);
    }
    else {
LAB_0024625d:
      uVar10 = (uint)uVar5;
      bVar14 = uVar10 != uVar12;
      uVar12 = uVar10;
      if (bVar14) {
        *pcVar7 = this->decimal_point_;
        pcVar7 = pcVar7 + 1;
        sVar11 = (long)(int)uVar10 - __n;
        memmove(pcVar7,this->digits_ + __n,sVar11);
        goto LAB_00246315;
      }
    }
    sVar11 = (long)(int)uVar12 - __n;
LAB_00246315:
    return pcVar7 + sVar11;
  }
  *it = '0';
  uVar13 = -uVar12;
  uVar10 = this->num_digits_;
  if (uVar10 == 0) {
    uVar10 = (this->specs_).precision;
    uVar3 = uVar13;
    if (SBORROW4(uVar10,uVar13) != (int)(uVar10 + uVar12) < 0) {
      uVar3 = uVar10;
    }
    if (-1 < (int)uVar10) {
      uVar13 = uVar3;
    }
    bVar14 = ((this->specs_).field_0x6 & 0x10) == 0;
  }
  else {
    uVar12 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
    bVar14 = uVar12 == 0;
    if ((int)uVar10 < 1 || (char)(uVar12 >> 0x14) != '\0') goto LAB_0024628f;
    bVar14 = true;
    do {
      if (this->digits_[(ulong)uVar10 - 1] != '0') goto LAB_0024628f;
      bVar2 = 1 < (int)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar2);
  }
  uVar10 = 0;
LAB_0024628f:
  if ((uVar10 == 0 && uVar13 == 0) && (bVar14)) {
    pcVar7 = it + 1;
  }
  else {
    it[1] = this->decimal_point_;
    pcVar9 = it + 2;
    pcVar7 = pcVar9;
    if (0 < (int)uVar13) {
      pcVar7 = pcVar9 + uVar13;
      memset(pcVar9,0x30,(ulong)uVar13);
    }
    if (uVar10 != 0) {
      memmove(pcVar7,this->digits_,(long)(int)uVar10);
    }
    pcVar7 = pcVar7 + (int)uVar10;
  }
  return pcVar7;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }